

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O2

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  int i;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  uint uVar12;
  Mat local_78;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 2) {
    uVar12 = bottom_top_blob->w;
    pvVar8 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar10 = 0;
    uVar9 = 0;
    if (0 < (int)uVar12) {
      uVar9 = (ulong)uVar12;
    }
    uVar7 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar7 = uVar10;
    }
    sVar6 = bottom_top_blob->elemsize;
    for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      fVar1 = *(float *)((long)pvVar4 + uVar10 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar10 * 4);
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar8 + uVar11 * 4) =
             *(float *)((long)pvVar8 + uVar11 * 4) * fVar2 + fVar1;
      }
      pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar12 * sVar6);
    }
  }
  else if (iVar3 == 1) {
    pvVar8 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar9 = 0;
    uVar10 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(float *)((long)pvVar8 + uVar9 * 4) =
           *(float *)((long)pvVar8 + uVar9 * 4) * *(float *)((long)pvVar5 + uVar9 * 4) +
           *(float *)((long)pvVar4 + uVar9 * 4);
    }
  }
  if (iVar3 - 3U < 2) {
    uVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar9 = 0;
    uVar10 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar10 = uVar9;
    }
    for (; (long)uVar9 < (long)this->channels; uVar9 = uVar9 + 1) {
      Mat::channel(&local_78,bottom_top_blob,(int)uVar9);
      pvVar8 = local_78.data;
      Mat::~Mat(&local_78);
      fVar1 = *(float *)((long)(this->a_data).data + uVar9 * 4);
      fVar2 = *(float *)((long)(this->b_data).data + uVar9 * 4);
      for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar8 + uVar7 * 4) * fVar2 + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j = 0; j < w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i = 0; i < size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}